

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_fixup(CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  CompilerMSL *this_local;
  
  bVar1 = Compiler::is_vertex_like_shader((Compiler *)this);
  if ((((bVar1) &&
       (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id),
       uVar2 != 0)) && (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     ((this->capture_output_to_buffer & 1U) == 0)) {
    if (((this->super_CompilerGLSL).options.vertex.fixup_clipspace & 1U) != 0) {
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[48]>
                (&this->super_CompilerGLSL,&this->qual_pos_var_name,(char (*) [7])".z = (",
                 &this->qual_pos_var_name,(char (*) [6])".z + ",&this->qual_pos_var_name,
                 (char (*) [48])".w) * 0.5;       // Adjust clip-space for Metal");
    }
    if (((this->super_CompilerGLSL).options.vertex.flip_vert_y & 1U) != 0) {
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string&,char_const(&)[5],char_const(&)[31]>
                (&this->super_CompilerGLSL,&this->qual_pos_var_name,(char (*) [8])".y = -(",
                 &this->qual_pos_var_name,(char (*) [5])0x4dcbed,
                 (char (*) [31])"    // Invert Y-axis for Metal");
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_fixup()
{
	if (is_vertex_like_shader() && stage_out_var_id && !qual_pos_var_name.empty() && !capture_output_to_buffer)
	{
		if (options.vertex.fixup_clipspace)
			statement(qual_pos_var_name, ".z = (", qual_pos_var_name, ".z + ", qual_pos_var_name,
			          ".w) * 0.5;       // Adjust clip-space for Metal");

		if (options.vertex.flip_vert_y)
			statement(qual_pos_var_name, ".y = -(", qual_pos_var_name, ".y);", "    // Invert Y-axis for Metal");
	}
}